

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O0

int YP_md_set_control_state(YPSpur *spur,int control_id,int state)

{
  int iVar1;
  undefined1 local_58 [8];
  YPSpur_msg msg;
  int state_local;
  int control_id_local;
  YPSpur *spur_local;
  
  local_58 = (undefined1  [8])0x1;
  msg.msg_type = (long)spur->pid;
  msg.pid._0_4_ = 0x102;
  msg._16_8_ = (BADTYPE)state;
  msg.pid._4_4_ = control_id;
  msg.data[3]._0_4_ = state;
  msg.data[3]._4_4_ = control_id;
  iVar1 = (*(spur->dev).send)(&spur->dev,(YPSpur_msg *)local_58);
  if (iVar1 < 0) {
    spur->connection_error = 1;
    spur_local._4_4_ = -1;
  }
  else {
    spur_local._4_4_ = 1;
  }
  return spur_local._4_4_;
}

Assistant:

int YP_md_set_control_state(YPSpur* spur, int control_id, int state)
{
  YPSpur_msg msg;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_PARAM_STATE;
  msg.cs = control_id;
  msg.data[0] = state;

  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }

  return 1;
}